

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void config_value_destroy(config_value *value)

{
  config_value *value_local;
  
  if (value->type == STRING) {
    free((value->data).string);
  }
  if ((value->type == ARRAY) && ((value->data).number != 0)) {
    config_array_destroy((value->data).array);
  }
  free(value);
  return;
}

Assistant:

void config_value_destroy(struct config_value *value)
{
        if (value->type == STRING) {
                // For strings we need to free the data as well
                free(value->data.string);
        }

        if (value->type == ARRAY && value->data.array != NULL) {
                config_array_destroy(value->data.array);
        }

        free(value);
}